

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O2

BrandedDecl * __thiscall
capnp::compiler::BrandedDecl::operator=(BrandedDecl *this,BrandedDecl *other)

{
  uint *puVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructDataBitCount SVar5;
  StructPointerCount SVar6;
  undefined2 uVar7;
  int iVar8;
  undefined4 uVar9;
  Refcounted *refcounted;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> local_20;
  
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  operator=(&this->body,&other->body);
  pCVar2 = (other->source)._reader.capTable;
  pvVar3 = (other->source)._reader.data;
  pWVar4 = (other->source)._reader.pointers;
  SVar5 = (other->source)._reader.dataSize;
  SVar6 = (other->source)._reader.pointerCount;
  uVar7 = *(undefined2 *)&(other->source)._reader.field_0x26;
  iVar8 = (other->source)._reader.nestingLimit;
  uVar9 = *(undefined4 *)&(other->source)._reader.field_0x2c;
  (this->source)._reader.segment = (other->source)._reader.segment;
  (this->source)._reader.capTable = pCVar2;
  (this->source)._reader.data = pvVar3;
  (this->source)._reader.pointers = pWVar4;
  (this->source)._reader.dataSize = SVar5;
  (this->source)._reader.pointerCount = SVar6;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar7;
  (this->source)._reader.nestingLimit = iVar8;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar9;
  if ((this->body).tag == 1) {
    local_20.disposer = (Disposer *)(other->brand).ptr;
    puVar1 = &(((BrandScope *)local_20.disposer)->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_20.ptr = (BrandScope *)local_20.disposer;
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=(&this->brand,&local_20);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::dispose(&local_20);
  }
  return this;
}

Assistant:

BrandedDecl& BrandedDecl::operator=(BrandedDecl& other) {
  body = other.body;
  source = other.source;
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
  return *this;
}